

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

UniValue *
blockToJSON(UniValue *__return_storage_ptr__,BlockManager *blockman,CBlock *block,CBlockIndex *tip,
           CBlockIndex *blockindex,TxVerbosity verbosity)

{
  pointer psVar1;
  string key;
  string key_00;
  string key_01;
  string str;
  string str_00;
  string key_02;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  uint32_t uVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  const_reference pvVar6;
  reference txundo;
  UniValue *__return_storage_ptr___00;
  char *pcVar7;
  pointer psVar8;
  ulong __n;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe8;
  uint in_stack_fffffffffffffbec;
  undefined8 in_stack_fffffffffffffbf0;
  CBlock *local_408;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *local_400;
  CBlockUndo blockUndo;
  undefined1 auStack_3e0 [16];
  undefined1 auStack_3d0 [32];
  string local_380 [32];
  UniValue local_360;
  uint256 local_308;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  UniValue local_270;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208 [16];
  UniValue txs;
  UniValue local_1a0;
  string local_148 [32];
  UniValue local_128;
  string local_d0 [32];
  UniValue local_b0;
  string local_58 [32];
  long local_38;
  
  uVar9 = (ulong)verbosity;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  blockheaderToJSON(__return_storage_ptr__,tip,blockindex);
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"strippedsize",(allocator<char> *)&local_308);
  txs._0_8_ = &TX_NO_WITNESS;
  txs.val._M_dataplus._M_p = (pointer)block;
  sVar4 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)&txs);
  criticalblock23.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock23.super_unique_lock._M_device._4_4_,(int)sVar4);
  UniValue::UniValue<int,_int,_true>(&local_b0,(int *)&criticalblock23);
  key._M_string_length = (size_type)__return_storage_ptr__;
  key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbd8;
  key.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffbe8;
  key.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbec;
  key.field_2._8_8_ = in_stack_fffffffffffffbf0;
  val_01.val._M_dataplus._M_p = (pointer)local_400;
  val_01._0_8_ = local_408;
  val_01.val._M_string_length =
       (size_type)
       blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
       super__Vector_impl_data._M_start;
  val_01.val.field_2._M_allocated_capacity =
       (size_type)
       blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  val_01.val.field_2._8_8_ =
       blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_3e0._0_8_;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_3e0._8_8_;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_3d0._0_8_;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_3d0._8_24_;
  UniValue::pushKV(__return_storage_ptr__,key,val_01);
  UniValue::~UniValue(&local_b0);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"size",(allocator<char> *)&local_308);
  txs._0_8_ = &TX_WITH_WITNESS;
  txs.val._M_dataplus._M_p = (pointer)block;
  sVar4 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)&txs);
  criticalblock23.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock23.super_unique_lock._M_device._4_4_,(int)sVar4);
  UniValue::UniValue<int,_int,_true>(&local_128,(int *)&criticalblock23);
  key_00._M_string_length = (size_type)__return_storage_ptr__;
  key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbd8;
  key_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffbe8;
  key_00.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbec;
  key_00.field_2._8_8_ = uVar9;
  val_02.val._M_dataplus._M_p = (pointer)local_400;
  val_02._0_8_ = local_408;
  val_02.val._M_string_length =
       (size_type)
       blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
       super__Vector_impl_data._M_start;
  val_02.val.field_2._M_allocated_capacity =
       (size_type)
       blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  val_02.val.field_2._8_8_ =
       blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_3e0._0_8_;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_3e0._8_8_;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_3d0._0_8_;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_3d0._8_24_;
  UniValue::pushKV(__return_storage_ptr__,key_00,val_02);
  UniValue::~UniValue(&local_128);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"weight",(allocator<char> *)&blockUndo);
  txs._0_8_ = &TX_NO_WITNESS;
  txs.val._M_dataplus._M_p = (pointer)block;
  sVar4 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)&txs);
  criticalblock23.super_unique_lock._M_device = (mutex_type *)&TX_WITH_WITNESS;
  criticalblock23.super_unique_lock._8_8_ = block;
  sVar5 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)&criticalblock23);
  local_308.super_base_blob<256U>.m_data._M_elems._0_4_ = (int)sVar5 + (int)sVar4 * 3;
  UniValue::UniValue<int,_int,_true>(&local_1a0,(int *)&local_308);
  key_01._M_string_length = (size_type)__return_storage_ptr__;
  key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbd8;
  key_01.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffbe8;
  key_01.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbec;
  key_01.field_2._8_8_ = uVar9;
  val_03.val._M_dataplus._M_p = (pointer)local_400;
  val_03._0_8_ = local_408;
  val_03.val._M_string_length =
       (size_type)
       blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
       super__Vector_impl_data._M_start;
  val_03.val.field_2._M_allocated_capacity =
       (size_type)
       blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  val_03.val.field_2._8_8_ =
       blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_3e0._0_8_;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_3e0._8_8_;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_3d0._0_8_;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_3d0._8_24_;
  UniValue::pushKV(__return_storage_ptr__,key_01,val_03);
  UniValue::~UniValue(&local_1a0);
  std::__cxx11::string::~string(local_148);
  local_218 = local_208;
  local_210 = 0;
  local_208[0] = 0;
  str._M_string_length = (size_type)__return_storage_ptr__;
  str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbd8;
  str.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffbe8;
  str.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbec;
  str.field_2._8_8_ = uVar9;
  UniValue::UniValue(&txs,VARR,str);
  std::__cxx11::string::~string((string *)&local_218);
  if ((int)uVar9 - 1U < 2) {
    blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock23,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp"
               ,0xc3,false);
    bVar3 = node::BlockManager::IsBlockPruned(blockman,blockindex);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock23.super_unique_lock);
    if (bVar3) {
LAB_00266f9a:
      in_stack_fffffffffffffbec = 0;
    }
    else {
      pcVar7 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp"
      ;
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock23,&cs_main,"::cs_main",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp"
                 ,0xc4,false);
      uVar2 = blockindex->nStatus;
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock23.super_unique_lock);
      if ((uVar2 & 0x10) == 0) goto LAB_00266f9a;
      bVar3 = node::BlockManager::UndoReadFromDisk(blockman,&blockUndo,blockindex);
      in_stack_fffffffffffffbec = (uint)CONCAT71((int7)((ulong)pcVar7 >> 8),1);
      if (!bVar3) {
        __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock23,
                   "Undo data expected but can\'t be read. This could be due to disk corruption or a conflict with a pruning event."
                   ,(allocator<char> *)&local_308);
        JSONRPCError(__return_storage_ptr___00,-0x7f5b,(string *)&criticalblock23);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_0026741f;
      }
    }
    local_400 = &block->vtx;
    in_stack_fffffffffffffbec = in_stack_fffffffffffffbec ^ 1;
    for (__n = 0; __n < (ulong)((long)(block->vtx).
                                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(block->vtx).
                                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1
        ) {
      pvVar6 = std::
               vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ::at(local_400,__n);
      if (__n == 0 || (char)in_stack_fffffffffffffbec != '\0') {
        txundo = (CTxUndo *)0x0;
      }
      else {
        txundo = std::vector<CTxUndo,_std::allocator<CTxUndo>_>::at(&blockUndo.vtxundo,__n - 1);
      }
      local_2e8 = local_2d8;
      local_2e0 = 0;
      local_2d8[0] = 0;
      str_00._M_string_length = (size_type)__return_storage_ptr__;
      str_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbd8;
      str_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffbe8;
      str_00.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbec;
      str_00.field_2._8_8_ = uVar9;
      UniValue::UniValue((UniValue *)&criticalblock23,VOBJ,str_00);
      std::__cxx11::string::~string((string *)&local_2e8);
      local_308.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_308.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      TxToUniv((pvVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               &local_308,(UniValue *)&criticalblock23,true,txundo,(TxVerbosity)uVar9);
      UniValue::UniValue(&local_360,(UniValue *)&criticalblock23);
      val_00.val._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      val_00._0_8_ = in_stack_fffffffffffffbd8;
      val_00.val._M_string_length._0_4_ = in_stack_fffffffffffffbe8;
      val_00.val._M_string_length._4_4_ = in_stack_fffffffffffffbec;
      val_00.val.field_2._M_allocated_capacity = uVar9;
      val_00.val.field_2._8_8_ = block;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_400;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                    super__Vector_impl_data._M_start;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)auStack_3e0._0_8_;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)auStack_3e0._8_8_;
      UniValue::push_back(&txs,val_00);
      UniValue::~UniValue(&local_360);
      UniValue::~UniValue((UniValue *)&criticalblock23);
    }
    std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&blockUndo.vtxundo);
    local_408 = block;
  }
  else if ((int)uVar9 == 0) {
    psVar1 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar8 = (block->vtx).
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar1; psVar8 = psVar8 + 1)
    {
      base_blob<256u>::GetHex_abi_cxx11_
                ((string *)&criticalblock23,
                 (base_blob<256u> *)
                 &((psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->hash);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_270,(string *)&criticalblock23);
      val.val._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      val._0_8_ = in_stack_fffffffffffffbd8;
      val.val._M_string_length._0_4_ = in_stack_fffffffffffffbe8;
      val.val._M_string_length._4_4_ = in_stack_fffffffffffffbec;
      val.val.field_2._M_allocated_capacity = uVar9;
      val.val.field_2._8_8_ = local_408;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_400;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                    super__Vector_impl_data._M_start;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)auStack_3e0._0_8_;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)auStack_3e0._8_8_;
      UniValue::push_back(&txs,val);
      UniValue::~UniValue(&local_270);
      std::__cxx11::string::~string((string *)&criticalblock23);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            (local_380,"tx",(allocator<char> *)&criticalblock23);
  UniValue::UniValue((UniValue *)(auStack_3e0 + 8),&txs);
  key_02._M_string_length = (size_type)__return_storage_ptr__;
  key_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbd8;
  key_02.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffbe8;
  key_02.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbec;
  key_02.field_2._8_8_ = uVar9;
  val_04.val._M_dataplus._M_p = (pointer)local_400;
  val_04._0_8_ = local_408;
  val_04.val._M_string_length =
       (size_type)
       blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
       super__Vector_impl_data._M_start;
  val_04.val.field_2._M_allocated_capacity =
       (size_type)
       blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  val_04.val.field_2._8_8_ =
       blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_3e0._0_8_;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_3e0._8_8_;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_3d0._0_8_;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)auStack_3d0._8_24_;
  UniValue::pushKV(__return_storage_ptr__,key_02,val_04);
  UniValue::~UniValue((UniValue *)(auStack_3e0 + 8));
  std::__cxx11::string::~string(local_380);
  UniValue::~UniValue(&txs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0026741f:
  __stack_chk_fail();
}

Assistant:

UniValue blockToJSON(BlockManager& blockman, const CBlock& block, const CBlockIndex& tip, const CBlockIndex& blockindex, TxVerbosity verbosity)
{
    UniValue result = blockheaderToJSON(tip, blockindex);

    result.pushKV("strippedsize", (int)::GetSerializeSize(TX_NO_WITNESS(block)));
    result.pushKV("size", (int)::GetSerializeSize(TX_WITH_WITNESS(block)));
    result.pushKV("weight", (int)::GetBlockWeight(block));
    UniValue txs(UniValue::VARR);

    switch (verbosity) {
        case TxVerbosity::SHOW_TXID:
            for (const CTransactionRef& tx : block.vtx) {
                txs.push_back(tx->GetHash().GetHex());
            }
            break;

        case TxVerbosity::SHOW_DETAILS:
        case TxVerbosity::SHOW_DETAILS_AND_PREVOUT:
            CBlockUndo blockUndo;
            const bool is_not_pruned{WITH_LOCK(::cs_main, return !blockman.IsBlockPruned(blockindex))};
            bool have_undo{is_not_pruned && WITH_LOCK(::cs_main, return blockindex.nStatus & BLOCK_HAVE_UNDO)};
            if (have_undo && !blockman.UndoReadFromDisk(blockUndo, blockindex)) {
                throw JSONRPCError(RPC_INTERNAL_ERROR, "Undo data expected but can't be read. This could be due to disk corruption or a conflict with a pruning event.");
            }
            for (size_t i = 0; i < block.vtx.size(); ++i) {
                const CTransactionRef& tx = block.vtx.at(i);
                // coinbase transaction (i.e. i == 0) doesn't have undo data
                const CTxUndo* txundo = (have_undo && i > 0) ? &blockUndo.vtxundo.at(i - 1) : nullptr;
                UniValue objTx(UniValue::VOBJ);
                TxToUniv(*tx, /*block_hash=*/uint256(), /*entry=*/objTx, /*include_hex=*/true, txundo, verbosity);
                txs.push_back(std::move(objTx));
            }
            break;
    }

    result.pushKV("tx", std::move(txs));

    return result;
}